

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O0

void __thiscall IPAsKey::IPAsKey(IPAsKey *this,uint8_t *addr,size_t addr_len)

{
  size_t local_20;
  size_t addr_len_local;
  uint8_t *addr_local;
  IPAsKey *this_local;
  
  this->_vptr_IPAsKey = (_func_int **)&PTR__IPAsKey_002233a0;
  this->HashNext = (IPAsKey *)0x0;
  this->count = 1;
  this->hash = 0;
  local_20 = addr_len;
  if (0x10 < addr_len) {
    local_20 = 0x10;
  }
  memcpy(this->addr,addr,local_20);
  this->addr_len = local_20;
  return;
}

Assistant:

IPAsKey::IPAsKey(uint8_t * addr, size_t addr_len)
    :
    HashNext(NULL),
    count(1),
    hash(0)
{
    if (addr_len > 16)
    {
        addr_len = 16;
    }

    memcpy(this->addr, addr, addr_len);
    this->addr_len = addr_len;
}